

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O2

int main(void)

{
  _Rb_tree_header *this;
  int iVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  iterator iVar4;
  long lVar5;
  cake_iterator<false> *pcVar6;
  allocator local_c81;
  iterator iter;
  multiset<DictKey,_std::less<DictKey>,_std::allocator<DictKey>_> lolz;
  string local_c28 [32];
  string local_c08 [32];
  string local_be8 [32];
  string local_bc8 [32];
  string local_ba8 [32];
  string local_b88 [32];
  string local_b68 [32];
  string local_b48 [32];
  undefined1 local_b28 [40];
  undefined1 local_b00 [40];
  undefined1 local_ad8 [40];
  undefined1 local_ab0 [40];
  undefined1 local_a88 [40];
  undefined1 local_a60 [40];
  skiplist<DictKey,_std::less<DictKey>_> aDict;
  
  skiplist<DictKey,_std::less<DictKey>_>::skiplist(&aDict);
  std::__cxx11::string::string(local_b48,"hello",(allocator *)&lolz);
  local_a60._0_4_ = 10;
  std::__cxx11::string::string((string *)(local_a60 + 8),local_b48);
  skiplist<DictKey,_std::less<DictKey>_>::insert(&aDict,(DictKey *)local_a60);
  std::__cxx11::string::~string((string *)(local_a60 + 8));
  std::__cxx11::string::~string(local_b48);
  std::__cxx11::string::string(local_b68,"jello",(allocator *)&lolz);
  local_a88._0_4_ = 0x14;
  std::__cxx11::string::string((string *)(local_a88 + 8),local_b68);
  skiplist<DictKey,_std::less<DictKey>_>::insert(&aDict,(DictKey *)local_a88);
  std::__cxx11::string::~string((string *)(local_a88 + 8));
  std::__cxx11::string::~string(local_b68);
  std::__cxx11::string::string(local_b88,"yello",(allocator *)&lolz);
  local_ab0._0_4_ = 0x14;
  std::__cxx11::string::string((string *)(local_ab0 + 8),local_b88);
  skiplist<DictKey,_std::less<DictKey>_>::insert(&aDict,(DictKey *)local_ab0);
  std::__cxx11::string::~string((string *)(local_ab0 + 8));
  std::__cxx11::string::~string(local_b88);
  std::__cxx11::string::string(local_ba8,"fello",(allocator *)&lolz);
  local_ad8._0_4_ = 0x28;
  std::__cxx11::string::string((string *)(local_ad8 + 8),local_ba8);
  skiplist<DictKey,_std::less<DictKey>_>::insert(&aDict,(DictKey *)local_ad8);
  std::__cxx11::string::~string((string *)(local_ad8 + 8));
  std::__cxx11::string::~string(local_ba8);
  operator<<((ostream *)&std::cout,&aDict);
  std::operator<<((ostream *)&std::cout,"SKIPLIST:\n");
  skiplist<DictKey,_std::less<DictKey>_>::begin(&iter,&aDict);
  this = &lolz._M_t._M_impl.super__Rb_tree_header;
  while( true ) {
    if (iter.node_count_ == 0 && iter.node == (SLNode<DictKey> *)0x0) break;
    DictKey::DictKey((DictKey *)&lolz,
                     ((iter.node)->valz).super__Vector_base<DictKey,_std::allocator<DictKey>_>.
                     _M_impl.super__Vector_impl_data._M_start +
                     ((long)iter.node_count_ref_ - (long)iter.node_count_));
    poVar2 = operator<<((ostream *)&std::cout,(DictKey *)&lolz);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)this);
    skiplist<DictKey,_std::less<DictKey>_>::cake_iterator<false>::operator++(&iter);
  }
  lolz._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lolz._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  lolz._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lolz._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &this->_M_header;
  lolz._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &this->_M_header;
  std::__cxx11::string::string(local_bc8,"hello",&local_c81);
  iter.node_count_ = 10;
  std::__cxx11::string::string((string *)&iter.reverse_,local_bc8);
  std::
  _Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
  ::_M_insert_equal<DictKey>(&lolz._M_t,(DictKey *)&iter);
  std::__cxx11::string::~string((string *)&iter.reverse_);
  std::__cxx11::string::~string(local_bc8);
  std::__cxx11::string::string(local_be8,"jello",&local_c81);
  iter.node_count_ = 0x14;
  std::__cxx11::string::string((string *)&iter.reverse_,local_be8);
  std::
  _Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
  ::_M_insert_equal<DictKey>(&lolz._M_t,(DictKey *)&iter);
  std::__cxx11::string::~string((string *)&iter.reverse_);
  std::__cxx11::string::~string(local_be8);
  std::__cxx11::string::string(local_c08,"yello",&local_c81);
  iter.node_count_ = 0x14;
  std::__cxx11::string::string((string *)&iter.reverse_,local_c08);
  std::
  _Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
  ::_M_insert_equal<DictKey>(&lolz._M_t,(DictKey *)&iter);
  std::__cxx11::string::~string((string *)&iter.reverse_);
  std::__cxx11::string::~string(local_c08);
  std::__cxx11::string::string(local_c28,"fello",&local_c81);
  iter.node_count_ = 0x28;
  std::__cxx11::string::string((string *)&iter.reverse_,local_c28);
  std::
  _Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
  ::_M_insert_equal<DictKey>(&lolz._M_t,(DictKey *)&iter);
  std::__cxx11::string::~string((string *)&iter.reverse_);
  std::__cxx11::string::~string(local_c28);
  std::operator<<((ostream *)&std::cout,"MULTISET:\n");
  for (p_Var3 = lolz._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != this; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    DictKey::DictKey((DictKey *)&iter,(DictKey *)(p_Var3 + 1));
    poVar2 = operator<<((ostream *)&std::cout,(DictKey *)&iter);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&iter.reverse_);
  }
  std::operator<<((ostream *)&std::cout,"MULTISET:\n");
  DictKey::DictKey((DictKey *)&iter,0x14);
  iVar4 = std::
          _Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
          ::find(&lolz._M_t,(key_type *)&iter);
  std::__cxx11::string::~string((string *)&iter.reverse_);
  poVar2 = std::operator<<((ostream *)&std::cout,"Found: ");
  poVar2 = operator<<(poVar2,(DictKey *)(iVar4._M_node + 1));
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Next: ");
  lVar5 = std::_Rb_tree_increment(iVar4._M_node);
  poVar2 = operator<<(poVar2,(DictKey *)(lVar5 + 0x20));
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Count: ");
  DictKey::DictKey((DictKey *)&iter,0x14);
  std::
  _Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
  ::count(&lolz._M_t,(key_type *)&iter);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&iter.reverse_);
  std::operator<<((ostream *)&std::cout,"SKIPLIST:\n");
  DictKey::DictKey((DictKey *)local_b00,0x14);
  skiplist<DictKey,_std::less<DictKey>_>::find(&iter,&aDict,(DictKey *)local_b00);
  std::__cxx11::string::~string((string *)(local_b00 + 8));
  poVar2 = std::operator<<((ostream *)&std::cout,"Found: ");
  poVar2 = operator<<(poVar2,((iter.node)->valz).
                             super__Vector_base<DictKey,_std::allocator<DictKey>_>._M_impl.
                             super__Vector_impl_data._M_start +
                             ((long)iter.node_count_ref_ - (long)iter.node_count_));
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Next: ");
  pcVar6 = skiplist<DictKey,_std::less<DictKey>_>::cake_iterator<false>::operator++(&iter);
  poVar2 = operator<<(poVar2,(pcVar6->node->valz).
                             super__Vector_base<DictKey,_std::allocator<DictKey>_>._M_impl.
                             super__Vector_impl_data._M_start +
                             ((long)pcVar6->node_count_ref_ - (long)pcVar6->node_count_));
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Count: ");
  DictKey::DictKey((DictKey *)local_b28,0x14);
  iVar1 = skiplist<DictKey,_std::less<DictKey>_>::count(&aDict,(DictKey *)local_b28);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)(local_b28 + 8));
  std::
  _Rb_tree<DictKey,_DictKey,_std::_Identity<DictKey>,_std::less<DictKey>,_std::allocator<DictKey>_>
  ::~_Rb_tree(&lolz._M_t);
  skiplist<DictKey,_std::less<DictKey>_>::~skiplist(&aDict);
  return 0;
}

Assistant:

int main() {
  skiplist<DictKey> aDict;

  aDict.insert({10, "hello"});
  aDict.insert({20, "jello"});
  aDict.insert({20, "yello"});
  aDict.insert({40, "fello"});

  std::cout << aDict;

  // foundit(aDict, DictKey{10});
  // foundit(aDict, DictKey{20});
  // foundit(aDict, DictKey{30});
  std::cout << "SKIPLIST:\n";
  for(auto e: aDict)
    std::cout << e << "\n";

  // same operations on multiset
  std::multiset<DictKey> lolz;
  lolz.insert({10, "hello"});
  lolz.insert({20, "jello"});
  lolz.insert({20, "yello"});
  lolz.insert({40, "fello"});

  std::cout << "MULTISET:\n";
  for(auto e: lolz)
    std::cout << e << "\n";

  // what about a find?
  // returns the first element inserted apparently
  std::cout << "MULTISET:\n";
  auto it = lolz.find(20);
  std::cout << "Found: " << *it << "\n";
  std::cout << "Next: " << *++it << "\n";
  std::cout << "Count: " << lolz.count(20) << "\n";

  // now to repeat it with our data structure
  std::cout << "SKIPLIST:\n";
  auto iter = aDict.find(20);
  std::cout << "Found: " << *iter << "\n";
  std::cout << "Next: " << *++iter << "\n";
  std::cout << "Count: " << aDict.count(20) << "\n";

  return 0;
}